

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.h
# Opt level: O1

int __thiscall QDate::daysInYear(QDate *this)

{
  bool bVar1;
  int iVar2;
  YearMonthDay YVar3;
  
  iVar2 = 0;
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    YVar3 = QGregorianCalendar::partsFromJulian(this->jd);
    iVar2 = 0;
    if (YVar3.month != -0x80000000) {
      iVar2 = YVar3.year;
    }
    bVar1 = QGregorianCalendar::leapTest(iVar2);
    iVar2 = bVar1 + 0x16d;
  }
  return iVar2;
}

Assistant:

constexpr bool isValid() const { return jd >= minJd() && jd <= maxJd(); }